

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockComparatorCopierTest.cpp
# Opt level: O2

void __thiscall
TEST_MockComparatorCopierTest_twoDifferentCustomTypeOutputParametersInSameFunctionCallSucceeds_Test
::testBody(TEST_MockComparatorCopierTest_twoDifferentCustomTypeOutputParametersInSameFunctionCallSucceeds_Test
           *this)

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  long *plVar3;
  undefined4 extraout_var_00;
  UtestShell *pUVar4;
  TestTerminator *pTVar5;
  char *pcVar6;
  char *pcVar7;
  SimpleString local_c0;
  SimpleString local_b0;
  SimpleString local_a0;
  SimpleString local_90;
  SimpleString local_80;
  SimpleString local_70;
  MyTypeForTesting actualObject2;
  MyTypeForTesting expectedObject2;
  MyTypeForTesting actualObject1;
  MyTypeForTesting expectedObject1;
  MyTypeForTestingCopier copier;
  
  MyTypeForTesting::MyTypeForTesting(&expectedObject1,0xb);
  MyTypeForTesting::MyTypeForTesting(&actualObject1,0x16);
  MyTypeForTesting::MyTypeForTesting(&expectedObject2,0x21);
  MyTypeForTesting::MyTypeForTesting(&actualObject2,0x2c);
  copier.super_MockNamedValueCopier._vptr_MockNamedValueCopier =
       (MockNamedValueCopier)&PTR__MockNamedValueCopier_002bc998;
  SimpleString::SimpleString(&local_c0,"");
  pMVar2 = mock(&local_c0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_b0,"MyTypeForTesting");
  (*pMVar2->_vptr_MockSupport[0x2d])(pMVar2,&local_b0,&copier);
  SimpleString::~SimpleString(&local_b0);
  SimpleString::~SimpleString(&local_c0);
  SimpleString::SimpleString(&local_c0,"");
  pMVar2 = mock(&local_c0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_b0,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_b0);
  SimpleString::SimpleString(&local_70,"MyTypeForTesting");
  SimpleString::SimpleString(&local_80,"bar");
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x38))
                             ((long *)CONCAT44(extraout_var,iVar1),&local_70,&local_80,
                              &expectedObject1);
  SimpleString::SimpleString(&local_90,"MyTypeForTesting");
  SimpleString::SimpleString(&local_a0,"foobar");
  (**(code **)(*plVar3 + 0x38))(plVar3,&local_90,&local_a0,&expectedObject2);
  SimpleString::~SimpleString(&local_a0);
  SimpleString::~SimpleString(&local_90);
  SimpleString::~SimpleString(&local_80);
  SimpleString::~SimpleString(&local_70);
  SimpleString::~SimpleString(&local_b0);
  SimpleString::~SimpleString(&local_c0);
  SimpleString::SimpleString(&local_c0,"");
  pMVar2 = mock(&local_c0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_b0,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_b0);
  SimpleString::SimpleString(&local_70,"MyTypeForTesting");
  SimpleString::SimpleString(&local_80,"bar");
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x30))
                             ((long *)CONCAT44(extraout_var_00,iVar1),&local_70,&local_80,
                              &actualObject1);
  SimpleString::SimpleString(&local_90,"MyTypeForTesting");
  SimpleString::SimpleString(&local_a0,"foobar");
  (**(code **)(*plVar3 + 0x30))(plVar3,&local_90,&local_a0,&actualObject2);
  SimpleString::~SimpleString(&local_a0);
  SimpleString::~SimpleString(&local_90);
  SimpleString::~SimpleString(&local_80);
  SimpleString::~SimpleString(&local_70);
  SimpleString::~SimpleString(&local_b0);
  SimpleString::~SimpleString(&local_c0);
  SimpleString::SimpleString(&local_c0,"");
  pMVar2 = mock(&local_c0,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x25])(pMVar2);
  SimpleString::~SimpleString(&local_c0);
  if (*expectedObject1.value == 0xb) {
    pUVar4 = UtestShell::getCurrent();
    pTVar5 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
               ,0x15c,pTVar5);
  }
  else {
    pUVar4 = UtestShell::getCurrent();
    ::StringFrom((int)&local_c0);
    pcVar6 = SimpleString::asCharString(&local_c0);
    ::StringFrom((long)&local_b0);
    pcVar7 = SimpleString::asCharString(&local_b0);
    pTVar5 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar6,pcVar7,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
               ,0x15c,pTVar5);
    SimpleString::~SimpleString(&local_b0);
    SimpleString::~SimpleString(&local_c0);
  }
  if (*actualObject1.value == 0xb) {
    pUVar4 = UtestShell::getCurrent();
    pTVar5 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
               ,0x15d,pTVar5);
  }
  else {
    pUVar4 = UtestShell::getCurrent();
    ::StringFrom((int)&local_c0);
    pcVar6 = SimpleString::asCharString(&local_c0);
    ::StringFrom((long)&local_b0);
    pcVar7 = SimpleString::asCharString(&local_b0);
    pTVar5 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar6,pcVar7,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
               ,0x15d,pTVar5);
    SimpleString::~SimpleString(&local_b0);
    SimpleString::~SimpleString(&local_c0);
  }
  if (*expectedObject2.value == 0x21) {
    pUVar4 = UtestShell::getCurrent();
    pTVar5 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
               ,0x15e,pTVar5);
  }
  else {
    pUVar4 = UtestShell::getCurrent();
    ::StringFrom((int)&local_c0);
    pcVar6 = SimpleString::asCharString(&local_c0);
    ::StringFrom((long)&local_b0);
    pcVar7 = SimpleString::asCharString(&local_b0);
    pTVar5 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar6,pcVar7,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
               ,0x15e,pTVar5);
    SimpleString::~SimpleString(&local_b0);
    SimpleString::~SimpleString(&local_c0);
  }
  if (*actualObject2.value == 0x21) {
    pUVar4 = UtestShell::getCurrent();
    pTVar5 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
               ,0x15f,pTVar5);
  }
  else {
    pUVar4 = UtestShell::getCurrent();
    ::StringFrom((int)&local_c0);
    pcVar6 = SimpleString::asCharString(&local_c0);
    ::StringFrom((long)&local_b0);
    pcVar7 = SimpleString::asCharString(&local_b0);
    pTVar5 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar6,pcVar7,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
               ,0x15f,pTVar5);
    SimpleString::~SimpleString(&local_b0);
    SimpleString::~SimpleString(&local_c0);
  }
  SimpleString::SimpleString(&local_c0,"");
  pMVar2 = mock(&local_c0,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x2f])(pMVar2);
  SimpleString::~SimpleString(&local_c0);
  MyTypeForTesting::~MyTypeForTesting(&actualObject2);
  MyTypeForTesting::~MyTypeForTesting(&expectedObject2);
  MyTypeForTesting::~MyTypeForTesting(&actualObject1);
  MyTypeForTesting::~MyTypeForTesting(&expectedObject1);
  return;
}

Assistant:

TEST(MockComparatorCopierTest, twoDifferentCustomTypeOutputParametersInSameFunctionCallSucceeds)
{
    MyTypeForTesting expectedObject1(11);
    MyTypeForTesting actualObject1(22);
    MyTypeForTesting expectedObject2(33);
    MyTypeForTesting actualObject2(44);
    MyTypeForTestingCopier copier;
    mock().installCopier("MyTypeForTesting", copier);

    mock().expectOneCall("foo")
        .withOutputParameterOfTypeReturning("MyTypeForTesting", "bar", &expectedObject1)
        .withOutputParameterOfTypeReturning("MyTypeForTesting", "foobar", &expectedObject2);
    mock().actualCall("foo")
        .withOutputParameterOfType("MyTypeForTesting", "bar", &actualObject1)
        .withOutputParameterOfType("MyTypeForTesting", "foobar", &actualObject2);

    mock().checkExpectations();
    CHECK_EQUAL(11, *(expectedObject1.value));
    CHECK_EQUAL(11, *(actualObject1.value));
    CHECK_EQUAL(33, *(expectedObject2.value));
    CHECK_EQUAL(33, *(actualObject2.value));

    mock().removeAllComparatorsAndCopiers();
}